

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_decodeFrameHeader(ZSTD_DCtx *dctx,void *src,size_t headerSize)

{
  uint uVar1;
  bool bVar2;
  size_t result;
  size_t headerSize_local;
  void *src_local;
  ZSTD_DCtx *dctx_local;
  
  dctx_local = (ZSTD_DCtx *)ZSTD_getFrameHeader_advanced(&dctx->fParams,src,headerSize,dctx->format)
  ;
  uVar1 = ERR_isError((size_t)dctx_local);
  if (uVar1 == 0) {
    if (dctx_local == (ZSTD_DCtx *)0x0) {
      if ((dctx->refMultipleDDicts == ZSTD_rmd_refMultipleDDicts) &&
         (dctx->ddictSet != (ZSTD_DDictHashSet *)0x0)) {
        ZSTD_DCtx_selectFrameDDict(dctx);
      }
      if (((dctx->fParams).dictID == 0) || (dctx->dictID == (dctx->fParams).dictID)) {
        bVar2 = false;
        if ((dctx->fParams).checksumFlag != 0) {
          bVar2 = dctx->forceIgnoreChecksum == ZSTD_d_validateChecksum;
        }
        dctx->validateChecksum = (uint)bVar2;
        if (dctx->validateChecksum != 0) {
          ZSTD_XXH64_reset(&dctx->xxhState,0);
        }
        dctx->processedCSize = headerSize + dctx->processedCSize;
        dctx_local = (ZSTD_DCtx *)0x0;
      }
      else {
        dctx_local = (ZSTD_DCtx *)0xffffffffffffffe0;
      }
    }
    else {
      dctx_local = (ZSTD_DCtx *)0xffffffffffffffb8;
    }
  }
  return (size_t)dctx_local;
}

Assistant:

static size_t ZSTD_decodeFrameHeader(ZSTD_DCtx* dctx, const void* src, size_t headerSize)
{
    size_t const result = ZSTD_getFrameHeader_advanced(&(dctx->fParams), src, headerSize, dctx->format);
    if (ZSTD_isError(result)) return result;    /* invalid header */
    RETURN_ERROR_IF(result>0, srcSize_wrong, "headerSize too small");

    /* Reference DDict requested by frame if dctx references multiple ddicts */
    if (dctx->refMultipleDDicts == ZSTD_rmd_refMultipleDDicts && dctx->ddictSet) {
        ZSTD_DCtx_selectFrameDDict(dctx);
    }

#ifndef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    /* Skip the dictID check in fuzzing mode, because it makes the search
     * harder.
     */
    RETURN_ERROR_IF(dctx->fParams.dictID && (dctx->dictID != dctx->fParams.dictID),
                    dictionary_wrong, "");
#endif
    dctx->validateChecksum = (dctx->fParams.checksumFlag && !dctx->forceIgnoreChecksum) ? 1 : 0;
    if (dctx->validateChecksum) XXH64_reset(&dctx->xxhState, 0);
    dctx->processedCSize += headerSize;
    return 0;
}